

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O3

void __thiscall HPreData::print(HPreData *this,int k)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  pointer piVar5;
  long lVar6;
  pointer pdVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  char buff [4];
  char local_40 [7];
  char local_39;
  ulong local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"N=",2);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->numCol);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",  M=",5);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->numRow);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",  NZ= ",7);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[this->numCol]);
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n-----in-------\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n-----cost-----\n",0x10);
  if (k == 2) {
    pdVar7 = (this->colCostAtEl).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->colCostAtEl).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar7) {
      uVar11 = 0;
      do {
        sprintf(local_40,"%2.1g ",pdVar7[uVar11]);
        *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
        sVar4 = strlen(local_40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_40,sVar4);
        uVar11 = uVar11 + 1;
        pdVar7 = (this->colCostAtEl).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(this->colCostAtEl).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar7 >> 3));
    }
  }
  else if (k == 1) {
    pdVar7 = (this->colCostAtEl).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->colCostAtEl).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar7) {
      uVar11 = 0;
      do {
        sprintf(local_40,"%2.1g ",pdVar7[uVar11]);
        *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
        sVar4 = strlen(local_40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_40,sVar4);
        uVar11 = uVar11 + 1;
        pdVar7 = (this->colCostAtEl).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(this->colCostAtEl).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar7 >> 3));
    }
  }
  else if ((k == 0) &&
          (pdVar7 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
          (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar7)) {
    uVar11 = 0;
    do {
      sprintf(local_40,"%2.1g ",pdVar7[uVar11]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar4 = strlen(local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_40,sVar4);
      uVar11 = uVar11 + 1;
      pdVar7 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(this->colCost).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar7 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------A-|-b-----\n",0x11);
  if (0 < (&this->numRow)[k != 0]) {
    local_38 = (ulong)(uint)(&this->numRow)[k != 0];
    uVar11 = 0;
    do {
      if ((this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] != 0) {
        piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar5 != 4) {
          uVar10 = 0;
          do {
            iVar2 = piVar5[uVar10];
            piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar6 = (long)iVar2;
            if (uVar11 != (uint)piVar5[lVar6]) {
              iVar8 = (this->Aend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10];
              if (iVar8 < iVar2) {
                iVar8 = iVar2;
              }
              do {
                if (iVar8 == lVar6) {
                  if ((this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10] == 0) goto LAB_0014c057;
                  goto LAB_0014c037;
                }
                lVar1 = lVar6 + 1;
                lVar6 = lVar6 + 1;
              } while (uVar11 != (uint)piVar5[lVar1]);
              iVar2 = (int)lVar6;
            }
            if ((this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10] != 0) {
              if (iVar2 < (this->Aend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10]) {
                sprintf(local_40,"%2.1g ",
                        (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar6]);
                *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
                sVar4 = strlen(local_40);
                pcVar9 = local_40;
              }
              else {
LAB_0014c037:
                *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
                sVar4 = 3;
                pcVar9 = "   ";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar4)
              ;
            }
LAB_0014c057:
            uVar10 = uVar10 + 1;
            piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (uVar10 < ((long)(this->Astart).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2) -
                            1U);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |   ",6);
        *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
        poVar3 = std::ostream::_M_insert<double>
                           ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar11]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," < < ",5);
        poVar3 = std::ostream::_M_insert<double>
                           ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar11]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------l------\n",0xe);
  pdVar7 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar7) {
    uVar11 = 0;
    do {
      if (pdVar7[uVar11] <= -1e+200) {
        builtin_strncpy(local_40,"-inf",5);
      }
      else {
        sprintf(local_40,"%2.1g ");
      }
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar4 = strlen(local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_40,sVar4);
      uVar11 = uVar11 + 1;
      pdVar7 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(this->colLower).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar7 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------u------\n",0xe);
  pdVar7 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar7) {
    uVar11 = 0;
    do {
      if (1e+200 <= pdVar7[uVar11]) {
        builtin_strncpy(local_40,"inf",4);
      }
      else {
        sprintf(local_40,"%2.1g ");
      }
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar4 = strlen(local_40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_40,sVar4);
      uVar11 = uVar11 + 1;
      pdVar7 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(this->colUpper).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar7 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void HPreData::print(int k) {
	cout<<"N="<<numCol<<",  M="<<numRow<<",  NZ= "<<Astart[numCol]<<'\n';
	cout<<"\n-----in-------\n";

	char buff [4];
	cout<<"\n-----cost-----\n";

	if (k==0) {
		for (size_t i=0;i<colCost.size();i++) {
			sprintf(buff, "%2.1g ", colCost[i]);
			cout<<std::setw(5)<<buff;
		}
	}

	if (k==1) {
		for (size_t i=0;i<colCostAtEl.size();i++) {
			sprintf(buff, "%2.1g ", colCostAtEl[i]);
			cout<<std::setw(5)<<buff;
		}
	}

	if (k==2) {
		for (size_t i=0;i<colCostAtEl.size();i++) {
			sprintf(buff, "%2.1g ", colCostAtEl[i]);
			cout<<std::setw(5)<<buff;
		}
	}
	cout<<endl;
	cout<<"------A-|-b-----\n";
	int rows= numRow;
	if (k)
		 rows= numRowOriginal;

	for (int i=0;i<rows;i++) {
		if (flagRow[i] ) {
			for (size_t j=0;j<Astart.size()-1;j++) {

				int ind = Astart[j];
				while (Aindex[ind]!=i && ind<Aend[j])
					ind++;

				if (!flagCol[j])
					continue;

				//if a_ij is nonzero print
				if (Aindex[ind]==i && ind<Aend[j])
				{
					sprintf(buff, "%2.1g ", Avalue[ind]);
					cout<<std::setw(5)<<buff;
					}
				else cout<<std::setw(5)<<"   ";

			}
			cout<<"  |   "<<std::setw(5)<<rowLower[i]<<" < < "<<rowUpper[i]<<endl;
		}
	}
	cout<<"------l------\n";
	for (size_t i=0;i<colLower.size();i++) {
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
	cout<<"------u------\n";
	for (size_t i=0;i<colUpper.size();i++) {
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else
			sprintf(buff, "inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
}